

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  byte bVar12;
  xmlChar *pxVar13;
  ulong uVar14;
  byte *arg1;
  xmlRelaxNGValidErr err;
  xmlRelaxNGDefinePtr_conflict define_00;
  xmlRelaxNGDefinePtr pxVar15;
  
LAB_0018887a:
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    pbVar7 = ctxt->state->value;
    if (pbVar7 == (byte *)0x0) {
      return 0;
    }
    bVar12 = *pbVar7;
    if (bVar12 == 0) {
      return 0;
    }
    while( true ) {
      pbVar7 = pbVar7 + 1;
      if (0x20 < bVar12) {
        return -1;
      }
      if ((0x100002600U >> ((ulong)bVar12 & 0x3f) & 1) == 0) break;
      bVar12 = *pbVar7;
    }
    if ((ulong)bVar12 != 0) {
      return -1;
    }
    return 0;
  default:
    goto switchD_0018888a_caseD_1;
  case XML_RELAXNG_EXCEPT:
    pxVar15 = define->content;
    while( true ) {
      if (pxVar15 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar15);
      if (iVar5 == 0) break;
      pxVar15 = pxVar15->next;
    }
    return -1;
  case XML_RELAXNG_TEXT:
    return 0;
  case XML_RELAXNG_DATATYPE:
    iVar5 = xmlRelaxNGValidateDatatype(ctxt,ctxt->state->value,define,ctxt->state->seq);
    if (iVar5 != 0) {
      return iVar5;
    }
    goto LAB_00188a11;
  case XML_RELAXNG_VALUE:
    pxVar11 = ctxt->state->value;
    iVar5 = xmlStrEqual(pxVar11,define->value);
    if (iVar5 != 0) goto LAB_00188a11;
    pxVar10 = define->name;
    if (pxVar10 == (xmlChar *)0x0) {
      pxVar10 = xmlRelaxNGNormalize(ctxt,define->value);
      pxVar11 = xmlRelaxNGNormalize(ctxt,pxVar11);
      if ((pxVar10 == (xmlChar *)0x0) || (pxVar11 == (xmlChar *)0x0)) {
        bVar3 = false;
        bVar4 = false;
        if (pxVar10 != (xmlChar *)0x0) goto LAB_00188d02;
      }
      else {
        iVar5 = xmlStrEqual(pxVar10,pxVar11);
        bVar4 = iVar5 != 0;
LAB_00188d02:
        bVar3 = bVar4;
        (*xmlFree)(pxVar10);
      }
      if (pxVar11 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar11);
      }
      if (!bVar3) {
        return -1;
      }
LAB_00188a11:
      xmlRelaxNGNextValue((xmlRelaxNGValidCtxtPtr)ctxt->state);
      return 0;
    }
    pvVar2 = define->data;
    if ((pvVar2 != (void *)0x0) && (*(code **)((long)pvVar2 + 0x20) != (code *)0x0)) {
      iVar5 = (**(code **)((long)pvVar2 + 0x20))
                        (*(undefined8 *)((long)pvVar2 + 8),pxVar10,define->value,define->node,
                         define->attrs,pxVar11,ctxt->state->node);
      if (-1 < iVar5) {
        if (iVar5 != 1) {
          return -1;
        }
        goto LAB_00188a11;
      }
      pxVar10 = define->name;
    }
    err = XML_RELAXNG_ERR_TYPECMP;
    goto LAB_0018889f;
  case XML_RELAXNG_LIST:
    pxVar10 = ctxt->state->value;
    pxVar11 = ctxt->state->endvalue;
    define_00 = define->content;
    pbVar8 = xmlStrdup(pxVar10);
    pbVar7 = pbVar8;
    if ((pbVar8 != (byte *)0x0) || (pbVar8 = xmlStrdup(""), pbVar7 = pbVar8, pbVar8 != (byte *)0x0))
    goto LAB_00188acd;
    err = XML_RELAXNG_ERR_NOSTATE;
    goto LAB_0018889d;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_GROUP:
    pxVar15 = define->content;
    while( true ) {
      if (pxVar15 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar15);
      if (iVar5 != 0) break;
      pxVar15 = pxVar15->next;
    }
    return -1;
  case XML_RELAXNG_REF:
  case XML_RELAXNG_PARENTREF:
    goto switchD_0018888a_caseD_b;
  case XML_RELAXNG_OPTIONAL:
    pxVar10 = ctxt->state->value;
    if (pxVar10 == (xmlChar *)0x0) {
      return 0;
    }
    if (*pxVar10 == '\0') {
      return 0;
    }
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    iVar5 = xmlRelaxNGValidateValue(ctxt,define->content);
    ctxt->flags = uVar1;
    if (iVar5 != 0) {
      ctxt->state->value = pxVar10;
    }
    if (ctxt->errNr < 1) {
      return 0;
    }
    goto LAB_00188bfc;
  case XML_RELAXNG_ZEROORMORE:
    goto switchD_0018888a_caseD_f;
  case XML_RELAXNG_ONEORMORE:
    for (pxVar15 = define->content; pxVar15 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar15 = pxVar15->next) {
      iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar15);
      if (iVar5 != 0) {
        return iVar5;
      }
    }
    goto switchD_0018888a_caseD_f;
  case XML_RELAXNG_CHOICE:
    pxVar10 = ctxt->state->value;
    pxVar15 = define->content;
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    if (pxVar15 != (xmlRelaxNGDefinePtr)0x0) {
      while (iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar15), iVar5 != 0) {
        ctxt->state->value = pxVar10;
        pxVar15 = pxVar15->next;
        if (pxVar15 == (xmlRelaxNGDefinePtr)0x0) {
          ctxt->flags = uVar1;
          if ((uVar1 & 1) == 0) {
            xmlRelaxNGDumpValidError(ctxt);
            return iVar5;
          }
          return iVar5;
        }
      }
    }
    ctxt->flags = uVar1;
  }
  goto LAB_00188bf6;
switchD_0018888a_caseD_b:
  define = define->content;
  if (define == (xmlRelaxNGDefinePtr)0x0) {
    err = XML_RELAXNG_ERR_NODEFINE;
LAB_0018889d:
    pxVar10 = (xmlChar *)0x0;
LAB_0018889f:
    xmlRelaxNGAddValidError(ctxt,err,pxVar10,(xmlChar *)0x0,0);
switchD_0018888a_caseD_1:
    return -1;
  }
  goto LAB_0018887a;
LAB_00188acd:
  uVar14 = (ulong)*pbVar8;
  if (0x20 < uVar14) {
LAB_00188af9:
    pbVar8 = pbVar8 + 1;
    goto LAB_00188acd;
  }
  pbVar9 = pbVar8;
  if ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0) {
    do {
      pbVar8 = pbVar9 + 1;
      *pbVar9 = 0;
      if (0x20 < (ulong)*pbVar8) break;
      pbVar9 = pbVar8;
    } while ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0);
    goto LAB_00188acd;
  }
  if (uVar14 != 0) goto LAB_00188af9;
  pxVar6 = ctxt->state;
  pxVar6->endvalue = pbVar8;
  pbVar9 = pbVar7;
  do {
    arg1 = pbVar9;
    if (arg1 == pbVar8) break;
    pbVar9 = arg1 + 1;
  } while (*arg1 == 0);
  pxVar6->value = arg1;
  if (define_00 == (xmlRelaxNGDefinePtr_conflict)0x0) {
LAB_00188bbf:
    if (arg1 != pxVar6->endvalue) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_LISTEXTRA,arg1,(xmlChar *)0x0,0);
      iVar5 = -1;
      goto LAB_00188c8a;
    }
  }
  else {
    do {
      pxVar6 = ctxt->state;
      if (pxVar6->value == pxVar6->endvalue) {
        pxVar6->value = (xmlChar *)0x0;
      }
      iVar5 = xmlRelaxNGValidateValue(ctxt,define_00);
      if (iVar5 != 0) goto LAB_00188c8a;
      define_00 = define_00->next;
    } while (define_00 != (xmlRelaxNGDefinePtr)0x0);
    pxVar6 = ctxt->state;
    arg1 = pxVar6->value;
    if (arg1 != (byte *)0x0) goto LAB_00188bbf;
  }
  iVar5 = 0;
LAB_00188c8a:
  (*xmlFree)(pbVar7);
  pxVar6 = ctxt->state;
  pxVar6->value = pxVar10;
  pxVar6->endvalue = pxVar11;
  return iVar5;
switchD_0018888a_caseD_f:
  pxVar6 = ctxt->state;
  pxVar10 = pxVar6->value;
  if (pxVar10 == (xmlChar *)0x0) {
    return 0;
  }
  if (*pxVar10 == '\0') {
    return 0;
  }
  uVar1 = ctxt->flags;
  ctxt->flags = uVar1 | 1;
  pxVar11 = (xmlChar *)0x0;
  do {
    pxVar13 = pxVar10;
    if ((pxVar11 == pxVar13) || (pxVar13 == pxVar6->endvalue)) break;
    pxVar15 = define->content;
    if (pxVar15 != (xmlRelaxNGDefinePtr)0x0) {
      do {
        iVar5 = xmlRelaxNGValidateValue(ctxt,pxVar15);
        if (iVar5 != 0) {
          ctxt->state->value = pxVar13;
          goto LAB_00188bf3;
        }
        pxVar15 = pxVar15->next;
      } while (pxVar15 != (xmlRelaxNGDefinePtr)0x0);
      pxVar6 = ctxt->state;
    }
    pxVar10 = pxVar6->value;
    pxVar11 = pxVar13;
  } while (pxVar6->value != (xmlChar *)0x0);
LAB_00188bf3:
  ctxt->flags = uVar1;
LAB_00188bf6:
  if (ctxt->errNr < 1) {
    return 0;
  }
LAB_00188bfc:
  xmlRelaxNGPopErrors(ctxt,0);
  return 0;
}

Assistant:

static int
xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,
                        xmlRelaxNGDefinePtr define)
{
    int ret = 0, oldflags;
    xmlChar *value;

    value = ctxt->state->value;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:{
                if ((value != NULL) && (value[0] != 0)) {
                    int idx = 0;

                    while (IS_BLANK_CH(value[idx]))
                        idx++;
                    if (value[idx] != 0)
                        ret = -1;
                }
                break;
            }
        case XML_RELAXNG_TEXT:
            break;
        case XML_RELAXNG_VALUE:{
                if (!xmlStrEqual(value, define->value)) {
                    if (define->name != NULL) {
                        xmlRelaxNGTypeLibraryPtr lib;

                        lib = (xmlRelaxNGTypeLibraryPtr) define->data;
                        if ((lib != NULL) && (lib->comp != NULL)) {
                            ret = lib->comp(lib->data, define->name,
                                            define->value, define->node,
                                            (void *) define->attrs,
                                            value, ctxt->state->node);
                        } else
                            ret = -1;
                        if (ret < 0) {
                            VALID_ERR2(XML_RELAXNG_ERR_TYPECMP,
                                       define->name);
                            return (-1);
                        } else if (ret == 1) {
                            ret = 0;
                        } else {
                            ret = -1;
                        }
                    } else {
                        xmlChar *nval, *nvalue;

                        /*
                         * TODO: trivial optimizations are possible by
                         * computing at compile-time
                         */
                        nval = xmlRelaxNGNormalize(ctxt, define->value);
                        nvalue = xmlRelaxNGNormalize(ctxt, value);

                        if ((nval == NULL) || (nvalue == NULL) ||
                            (!xmlStrEqual(nval, nvalue)))
                            ret = -1;
                        if (nval != NULL)
                            xmlFree(nval);
                        if (nvalue != NULL)
                            xmlFree(nvalue);
                    }
                }
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);
                break;
            }
        case XML_RELAXNG_DATATYPE:{
                ret = xmlRelaxNGValidateDatatype(ctxt, value, define,
                                                 ctxt->state->seq);
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);

                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue;

                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;

                oldvalue = ctxt->state->value;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        break;
                    }
                    ctxt->state->value = oldvalue;
                    list = list->next;
                }
                ctxt->flags = oldflags;
                if (ret != 0) {
                    if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                        xmlRelaxNGDumpValidError(ctxt);
                } else {
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                }
                break;
            }
        case XML_RELAXNG_LIST:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue, *oldend, *val, *cur;

                oldvalue = ctxt->state->value;
                oldend = ctxt->state->endvalue;

                val = xmlStrdup(oldvalue);
                if (val == NULL) {
                    val = xmlStrdup(BAD_CAST "");
                }
                if (val == NULL) {
                    VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                    return (-1);
                }
                cur = val;
                while (*cur != 0) {
                    if (IS_BLANK_CH(*cur)) {
                        *cur = 0;
                        cur++;
                        while (IS_BLANK_CH(*cur))
                            *cur++ = 0;
                    } else
                        cur++;
                }
                ctxt->state->endvalue = cur;
                cur = val;
                while ((*cur == 0) && (cur != ctxt->state->endvalue))
                    cur++;

                ctxt->state->value = cur;

                while (list != NULL) {
                    if (ctxt->state->value == ctxt->state->endvalue)
                        ctxt->state->value = NULL;
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        break;
                    }
                    list = list->next;
                }

                if ((ret == 0) && (ctxt->state->value != NULL) &&
                    (ctxt->state->value != ctxt->state->endvalue)) {
                    VALID_ERR2(XML_RELAXNG_ERR_LISTEXTRA,
                               ctxt->state->value);
                    ret = -1;
                }
                xmlFree(val);
                ctxt->state->value = oldvalue;
                ctxt->state->endvalue = oldend;
                break;
            }
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGValidateValueList(ctxt, define->content);
            if (ret != 0) {
                break;
            }
            /* Falls through. */
        case XML_RELAXNG_ZEROORMORE:{
                xmlChar *cur, *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                cur = ctxt->state->value;
                temp = NULL;
                while ((cur != NULL) && (cur != ctxt->state->endvalue) &&
                       (temp != cur)) {
                    temp = cur;
                    ret =
                        xmlRelaxNGValidateValueList(ctxt, define->content);
                    if (ret != 0) {
                        ctxt->state->value = temp;
                        ret = 0;
                        break;
                    }
                    cur = ctxt->state->value;
                }
                ctxt->flags = oldflags;
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_OPTIONAL:{
                xmlChar *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                temp = ctxt->state->value;
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
                ctxt->flags = oldflags;
                if (ret != 0) {
                    ctxt->state->value = temp;
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                    ret = 0;
                    break;
                }
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_EXCEPT:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_PARENTREF:
	    if (define->content == NULL) {
                VALID_ERR(XML_RELAXNG_ERR_NODEFINE);
                ret = -1;
	    } else {
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
            }
            break;
        default:
            /* TODO */
            ret = -1;
    }
    return (ret);
}